

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_ChangeCamera(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  AActor *pAVar1;
  AActor *pAVar2;
  AActor *oldcamera_1;
  AActor *oldcamera;
  undefined1 local_40 [4];
  int i;
  FActorIterator iterator;
  AActor *camera;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg0 == 0) {
    iterator.id = 0;
    iterator._12_4_ = 0;
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_40,arg0);
    iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_40);
  }
  if (((it == (AActor *)0x0) || (it->player == (player_t *)0x0)) || (arg1 != 0)) {
    for (oldcamera._4_4_ = 0; oldcamera._4_4_ < 8; oldcamera._4_4_ = oldcamera._4_4_ + 1) {
      if ((playeringame[oldcamera._4_4_] & 1U) != 0) {
        pAVar1 = TObjPtr::operator_cast_to_AActor_
                           ((TObjPtr *)(&DAT_01ae7238 + (long)oldcamera._4_4_ * 0x2a0));
        if (iterator._8_8_ == 0) {
          TObjPtr<AActor>::operator=
                    ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)oldcamera._4_4_ * 0x2a0),
                     (AActor *)(&players)[(long)oldcamera._4_4_ * 0x54]);
          *(uint *)(&DAT_01ae71a8 + (long)oldcamera._4_4_ * 0x2a0) =
               *(uint *)(&DAT_01ae71a8 + (long)oldcamera._4_4_ * 0x2a0) & 0xffffff7f;
        }
        else {
          TObjPtr<AActor>::operator=
                    ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)oldcamera._4_4_ * 0x2a0),
                     (AActor *)iterator._8_8_);
          if (arg2 != 0) {
            *(uint *)(&DAT_01ae71a8 + (long)oldcamera._4_4_ * 0x2a0) =
                 *(uint *)(&DAT_01ae71a8 + (long)oldcamera._4_4_ * 0x2a0) | 0x80;
          }
        }
        pAVar2 = TObjPtr::operator_cast_to_AActor_
                           ((TObjPtr *)(&DAT_01ae7238 + (long)oldcamera._4_4_ * 0x2a0));
        if (pAVar1 != pAVar2) {
          pAVar1 = TObjPtr::operator_cast_to_AActor_
                             ((TObjPtr *)(&DAT_01ae7238 + (long)oldcamera._4_4_ * 0x2a0));
          R_ClearPastViewer(pAVar1);
        }
      }
    }
  }
  else {
    pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&it->player->camera);
    if (iterator._8_8_ == 0) {
      TObjPtr<AActor>::operator=(&it->player->camera,it);
      it->player->cheats = it->player->cheats & 0xffffff7f;
    }
    else {
      TObjPtr<AActor>::operator=(&it->player->camera,(AActor *)iterator._8_8_);
      if (arg2 != 0) {
        it->player->cheats = it->player->cheats | 0x80;
      }
    }
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&it->player->camera);
    if (pAVar1 != pAVar2) {
      pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&it->player->camera);
      R_ClearPastViewer(pAVar1);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ChangeCamera)
// ChangeCamera (tid, who, revert?)
{
	AActor *camera;
	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		camera = iterator.Next ();
	}
	else
	{
		camera = NULL;
	}

	if (!it || !it->player || arg1)
	{
		int i;

		for (i = 0; i < MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			AActor *oldcamera = players[i].camera;
			if (camera)
			{
				players[i].camera = camera;
				if (arg2)
					players[i].cheats |= CF_REVERTPLEASE;
			}
			else
			{
				players[i].camera = players[i].mo;
				players[i].cheats &= ~CF_REVERTPLEASE;
			}
			if (oldcamera != players[i].camera)
			{
				R_ClearPastViewer (players[i].camera);
			}
		}
	}
	else
	{
		AActor *oldcamera = it->player->camera;
		if (camera)
		{
			it->player->camera = camera;
			if (arg2)
				it->player->cheats |= CF_REVERTPLEASE;
		}
		else
		{
			it->player->camera = it;
			it->player->cheats &= ~CF_REVERTPLEASE;
		}
		if (oldcamera != it->player->camera)
		{
			R_ClearPastViewer (it->player->camera);
		}
	}

	return true;
}